

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.hpp
# Opt level: O1

ClockSync * binlog::systemClockSync(void)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  ClockSync *in_RDI;
  uint64_t uVar5;
  char offset_str [6];
  time_t now_tt;
  char tzName [128];
  tm now_tm;
  char local_e8 [8];
  long local_e0;
  timespec local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  tm local_58;
  
  local_d8.tv_sec = 0;
  local_d8.tv_nsec = 0;
  clock_gettime(0,&local_d8);
  uVar5 = local_d8.tv_sec * 1000000000 + local_d8.tv_nsec;
  local_e0 = (long)uVar5 / 1000000000;
  local_58.tm_isdst = 0;
  local_58._36_4_ = 0;
  local_58.tm_gmtoff = 0;
  local_58.tm_mon = 0;
  local_58.tm_year = 0;
  local_58.tm_wday = 0;
  local_58.tm_yday = 0;
  local_58.tm_sec = 0;
  local_58.tm_min = 0;
  local_58.tm_hour = 0;
  local_58.tm_mday = 0;
  local_58.tm_zone = (char *)0x0;
  localtime_r(&local_e0,&local_58);
  local_e8[4] = '\0';
  local_e8[5] = '\0';
  local_e8[0] = '\0';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '\0';
  sVar2 = strftime(local_e8,6,"%z",&local_58);
  iVar4 = 0;
  if (sVar2 == 5) {
    iVar1 = ((int)local_e8[2] + local_e8[1] * 10) * 0xe10;
    iVar3 = ((int)local_e8[4] + local_e8[3] * 10) * 0x3c;
    iVar4 = 0x1d7cc0 - (iVar3 + iVar1);
    if (local_e8[0] != '-') {
      iVar4 = iVar1 + iVar3 + -0x1d7cc0;
    }
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8.tv_sec = 0;
  local_d8.tv_nsec = 0;
  sVar2 = strftime((char *)&local_d8,0x80,"%Z",&local_58);
  if (sVar2 == 0) {
    local_d8.tv_sec = local_d8.tv_sec & 0xffffffffffffff00;
  }
  in_RDI->clockValue = uVar5;
  in_RDI->clockFrequency = 1000000000;
  in_RDI->nsSinceEpoch = uVar5;
  in_RDI->tzOffset = iVar4;
  (in_RDI->tzName)._M_dataplus._M_p = (pointer)&(in_RDI->tzName).field_2;
  sVar2 = strlen((char *)&local_d8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&in_RDI->tzName,&local_d8,(long)&local_d8.tv_sec + sVar2);
  return in_RDI;
}

Assistant:

inline ClockSync systemClockSync()
{
  using Clock = std::chrono::system_clock;

  const auto since_epoch = clockSinceEpoch();
  const auto now_tp = Clock::time_point(std::chrono::duration_cast<Clock::duration>(since_epoch));
  const std::time_t now_tt = Clock::to_time_t(now_tp);

  std::tm now_tm{};
  #ifdef _WIN32
    localtime_s(&now_tm, &now_tt);
  #else // assume POSIX
    localtime_r(&now_tt, &now_tm);
  #endif

  // TODO(benedek) platform: access TZ related tm fields, where available
  int offset = 0;
  char offset_str[6] = {0};
  if (strftime(offset_str, sizeof(offset_str), "%z", &now_tm) == 5)
  {
    // offset_str is +HHMM or -HHMM
    offset = (
      ((offset_str[1]-'0') * 10 + (offset_str[2]-'0')) * 3600 +
      ((offset_str[3]-'0') * 10 + (offset_str[4]-'0')) * 60
    ) * ((offset_str[0] == '-') ? -1 : 1);
  }

  char tzName[128] = {0};
  if (strftime(tzName, sizeof(tzName), "%Z", &now_tm) == 0)
  {
    tzName[0] = 0;
  }

  using Period = decltype(since_epoch)::period;
  static_assert(Period::num == 1, "Clock measures integer fractions of a second");
  const uint64_t frequency = std::uint64_t(Period::den);

  return ClockSync{
    std::uint64_t(since_epoch.count()),
    frequency,
    std::uint64_t(std::chrono::duration_cast<std::chrono::nanoseconds>(since_epoch).count()),
    offset,
    tzName
  };
}